

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
* spvtools::opt::anon_unknown_21::GetLocationsAccessed
            (set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             *__return_storage_ptr__,
            map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
            *stores,map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
                    *loads)

{
  bool bVar1;
  reference ppVar2;
  type *ppIVar3;
  pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *kv_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
  *__range2_1;
  pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  *kv;
  const_iterator __end2;
  const_iterator __begin2;
  map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
  *__range2;
  map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
  *loads_local;
  map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
  *stores_local;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *locations;
  
  memset(__return_storage_ptr__,0,0x30);
  std::
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  ::set(__return_storage_ptr__);
  __end2 = std::
           map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
           ::begin(stores);
  kv = (pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        *)std::
          map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
          ::end(stores);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&kv), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
             ::operator*(&__end2);
    ppIVar3 = std::
              get<0ul,spvtools::opt::Instruction*const,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
                        (ppVar2);
    std::
    set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::insert(__return_storage_ptr__,ppIVar3);
    std::
    _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
             ::begin(loads);
  kv_1 = (pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          *)std::
            map<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
            ::end(loads);
  while (bVar1 = std::operator!=(&__end2_1,(_Self *)&kv_1), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
             ::operator*(&__end2_1);
    ppIVar3 = std::
              get<0ul,spvtools::opt::Instruction*const,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
                        (ppVar2);
    std::
    set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::insert(__return_storage_ptr__,ppIVar3);
    std::
    _Rb_tree_const_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>_>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Instruction*> GetLocationsAccessed(
    const std::map<Instruction*, std::vector<Instruction*>>& stores,
    const std::map<Instruction*, std::vector<Instruction*>>& loads) {
  std::set<Instruction*> locations{};

  for (const auto& kv : stores) {
    locations.insert(std::get<0>(kv));
  }

  for (const auto& kv : loads) {
    locations.insert(std::get<0>(kv));
  }

  return locations;
}